

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_session_save(mbedtls_ssl_session *session,uchar *buf,size_t buf_len,size_t *olen)

{
  ushort uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  size_t __n;
  uchar *p;
  ulong uVar10;
  
  if (session == (mbedtls_ssl_session *)0x0) {
    return -0x6c00;
  }
  if (4 < buf_len) {
    buf[4] = ssl_serialized_session_header[4];
    *(undefined4 *)buf = ssl_serialized_session_header._0_4_;
    if (buf_len != 5) {
      buf[5] = (char)session->tls_version;
      buf = buf + 6;
      bVar8 = true;
      goto LAB_001a2b5e;
    }
    buf = buf + 5;
  }
  bVar8 = false;
LAB_001a2b5e:
  iVar9 = -0x7080;
  if (session->tls_version == MBEDTLS_SSL_VERSION_TLS1_2) {
    uVar10 = 0;
    if (bVar8) {
      uVar10 = buf_len - 6;
    }
    if (0x56 < uVar10) {
      uVar1 = (ushort)session->ciphersuite;
      *(ushort *)buf = uVar1 << 8 | uVar1 >> 8;
      *(char *)((long)buf + 2) = (char)session->id_len;
      uVar3 = *(undefined8 *)session->id;
      uVar4 = *(undefined8 *)(session->id + 8);
      uVar5 = *(undefined8 *)(session->id + 0x18);
      *(undefined8 *)((long)buf + 0x13) = *(undefined8 *)(session->id + 0x10);
      *(undefined8 *)((long)buf + 0x1b) = uVar5;
      *(undefined8 *)((long)buf + 3) = uVar3;
      *(undefined8 *)((long)buf + 0xb) = uVar4;
      uVar3 = *(undefined8 *)(session->master + 8);
      uVar4 = *(undefined8 *)(session->master + 0x10);
      uVar5 = *(undefined8 *)(session->master + 0x18);
      uVar6 = *(undefined8 *)(session->master + 0x20);
      uVar7 = *(undefined8 *)(session->master + 0x28);
      *(undefined8 *)((long)buf + 0x23) = *(undefined8 *)session->master;
      *(undefined8 *)((long)buf + 0x2b) = uVar3;
      *(undefined8 *)((long)buf + 0x33) = uVar4;
      *(undefined8 *)((long)buf + 0x3b) = uVar5;
      *(undefined8 *)((long)buf + 0x43) = uVar6;
      *(undefined8 *)((long)buf + 0x4b) = uVar7;
      uVar2 = session->verify_result;
      *(uint *)((long)buf + 0x53) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      buf = (uchar *)((long)buf + 0x57);
    }
    if (session->peer_cert == (mbedtls_x509_crt *)0x0) {
      __n = 0;
    }
    else {
      __n = (session->peer_cert->raw).len;
    }
    if (__n + 0x5a <= uVar10) {
      *buf = (char)(__n >> 0x10);
      *(char *)((long)buf + 1) = (char)(__n >> 8);
      *(char *)((long)buf + 2) = (char)__n;
      buf = (uchar *)((long)buf + 3);
      if (session->peer_cert != (mbedtls_x509_crt *)0x0) {
        memcpy(buf,(session->peer_cert->raw).p,__n);
        buf = (uchar *)((long)buf + __n);
      }
    }
    if (__n + 0x5b <= uVar10) {
      *buf = session->mfl_code;
    }
    *olen = __n + 0x61;
    iVar9 = -0x6a00;
    if (__n + 0x61 <= buf_len) {
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_session_save(const mbedtls_ssl_session *session,
                            unsigned char omit_header,
                            unsigned char *buf,
                            size_t buf_len,
                            size_t *olen)
{
    unsigned char *p = buf;
    size_t used = 0;
    size_t remaining_len;
#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    size_t out_len;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
#endif
    if (session == NULL) {
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    if (!omit_header) {
        /*
         * Add Mbed TLS version identifier
         */
        used += sizeof(ssl_serialized_session_header);

        if (used <= buf_len) {
            memcpy(p, ssl_serialized_session_header,
                   sizeof(ssl_serialized_session_header));
            p += sizeof(ssl_serialized_session_header);
        }
    }

    /*
     * TLS version identifier
     */
    used += 1;
    if (used <= buf_len) {
        *p++ = MBEDTLS_BYTE_0(session->tls_version);
    }

    /* Forward to version-specific serialization routine. */
    remaining_len = (buf_len >= used) ? buf_len - used : 0;
    switch (session->tls_version) {
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        case MBEDTLS_SSL_VERSION_TLS1_2:
            used += ssl_tls12_session_save(session, p, remaining_len);
            break;
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
        case MBEDTLS_SSL_VERSION_TLS1_3:
            ret = ssl_tls13_session_save(session, p, remaining_len, &out_len);
            if (ret != 0 && ret != MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL) {
                return ret;
            }
            used += out_len;
            break;
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

        default:
            return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    }

    *olen = used;
    if (used > buf_len) {
        return MBEDTLS_ERR_SSL_BUFFER_TOO_SMALL;
    }

    return 0;
}